

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

int OPENSSL_sk_find(OPENSSL_STACK *sk,size_t *out_index,void *p,
                   OPENSSL_sk_call_cmp_func call_cmp_func)

{
  int iVar1;
  size_t sVar2;
  int r;
  size_t mid;
  size_t hi;
  size_t lo;
  size_t i_1;
  size_t i;
  OPENSSL_sk_call_cmp_func call_cmp_func_local;
  void *p_local;
  size_t *out_index_local;
  OPENSSL_STACK *sk_local;
  
  if (sk != (OPENSSL_STACK *)0x0) {
    if (sk->comp == (OPENSSL_sk_cmp_func)0x0) {
      for (i_1 = 0; i_1 < sk->num; i_1 = i_1 + 1) {
        if (sk->data[i_1] == p) {
          if (out_index != (size_t *)0x0) {
            *out_index = i_1;
          }
          return 1;
        }
      }
    }
    else if (p != (void *)0x0) {
      iVar1 = OPENSSL_sk_is_sorted(sk);
      if (iVar1 == 0) {
        for (lo = 0; lo < sk->num; lo = lo + 1) {
          iVar1 = (*call_cmp_func)(sk->comp,p,sk->data[lo]);
          if (iVar1 == 0) {
            if (out_index != (size_t *)0x0) {
              *out_index = lo;
            }
            return 1;
          }
        }
      }
      else {
        hi = 0;
        sVar2 = sk->num;
        while (mid = sVar2, hi < mid) {
          sVar2 = hi + ((mid - hi) - 1 >> 1);
          if (sVar2 < hi || mid <= sVar2) {
            __assert_fail("lo <= mid && mid < hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                          ,0x113,
                          "int OPENSSL_sk_find(const OPENSSL_STACK *, size_t *, const void *, OPENSSL_sk_call_cmp_func)"
                         );
          }
          iVar1 = (*call_cmp_func)(sk->comp,p,sk->data[sVar2]);
          if (iVar1 < 1) {
            if (-1 < iVar1) {
              if (mid - hi == 1) {
                if (out_index != (size_t *)0x0) {
                  *out_index = sVar2;
                }
                return 1;
              }
              if (mid <= sVar2 + 1) {
                __assert_fail("mid + 1 < hi",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                              ,0x124,
                              "int OPENSSL_sk_find(const OPENSSL_STACK *, size_t *, const void *, OPENSSL_sk_call_cmp_func)"
                             );
              }
              sVar2 = sVar2 + 1;
            }
          }
          else {
            hi = sVar2 + 1;
            sVar2 = mid;
          }
        }
        if (hi != mid) {
          __assert_fail("lo == hi",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                        ,0x129,
                        "int OPENSSL_sk_find(const OPENSSL_STACK *, size_t *, const void *, OPENSSL_sk_call_cmp_func)"
                       );
        }
      }
    }
  }
  return 0;
}

Assistant:

int OPENSSL_sk_find(const OPENSSL_STACK *sk, size_t *out_index, const void *p,
                    OPENSSL_sk_call_cmp_func call_cmp_func) {
  if (sk == NULL) {
    return 0;
  }

  if (sk->comp == NULL) {
    // Use pointer equality when no comparison function has been set.
    for (size_t i = 0; i < sk->num; i++) {
      if (sk->data[i] == p) {
        if (out_index) {
          *out_index = i;
        }
        return 1;
      }
    }
    return 0;
  }

  if (p == NULL) {
    return 0;
  }

  if (!OPENSSL_sk_is_sorted(sk)) {
    for (size_t i = 0; i < sk->num; i++) {
      if (call_cmp_func(sk->comp, p, sk->data[i]) == 0) {
        if (out_index) {
          *out_index = i;
        }
        return 1;
      }
    }
    return 0;
  }

  // The stack is sorted, so binary search to find the element.
  //
  // |lo| and |hi| maintain a half-open interval of where the answer may be. All
  // indices such that |lo <= idx < hi| are candidates.
  size_t lo = 0, hi = sk->num;
  while (lo < hi) {
    // Bias |mid| towards |lo|. See the |r == 0| case below.
    size_t mid = lo + (hi - lo - 1) / 2;
    assert(lo <= mid && mid < hi);
    int r = call_cmp_func(sk->comp, p, sk->data[mid]);
    if (r > 0) {
      lo = mid + 1;  // |mid| is too low.
    } else if (r < 0) {
      hi = mid;  // |mid| is too high.
    } else {
      // |mid| matches. However, this function returns the earliest match, so we
      // can only return if the range has size one.
      if (hi - lo == 1) {
        if (out_index != NULL) {
          *out_index = mid;
        }
        return 1;
      }
      // The sample is biased towards |lo|. |mid| can only be |hi - 1| if
      // |hi - lo| was one, so this makes forward progress.
      assert(mid + 1 < hi);
      hi = mid + 1;
    }
  }

  assert(lo == hi);
  return 0;  // Not found.
}